

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O0

void __thiscall
TPZMeshSolution::TPZMeshSolution(TPZMeshSolution *this,void **vtt,TPZCompMesh *cmesh,int materialid)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  undefined4 uVar3;
  TPZFunction<double> TVar4;
  undefined4 in_ECX;
  TPZFunction<double> in_RDX;
  TPZFunction<double> *in_RSI;
  TPZFunction<double> *in_RDI;
  TPZGeoEl *gel;
  int64_t el;
  int64_t nel;
  TPZMaterial *material;
  size_t in_stack_000002f8;
  char *in_stack_00000300;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  TPZGeoMesh *in_stack_fffffffffffffee0;
  int64_t in_stack_fffffffffffffef8;
  int matid;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  allocator<char> *in_stack_ffffffffffffff10;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  TPZManVector<double,_3> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  TPZFunction<double> local_a0;
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined8 local_38;
  undefined4 local_1c;
  TPZFunction<double> local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  TPZFunction<double>::TPZFunction(in_RDI,(void **)(in_RSI + 1));
  *in_RDI = *in_RSI;
  *(TPZFunction<double> *)(&in_RDI->field_0x0 + *(long *)((long)*in_RDI + -0x60)) = in_RSI[3];
  in_RDI[1] = local_18;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  matid = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  *(undefined4 *)&in_RDI[0xc].field_0x4 = local_1c;
  iVar2 = TPZCompMesh::Dimension((TPZCompMesh *)local_18);
  *(int *)(in_RDI + 10) = iVar2;
  local_38 = 0;
  TPZManVector<double,_3>::Resize
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
             ,(double *)in_stack_ffffffffffffff10);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TPZCompMesh::FindMaterial
                       ((TPZCompMesh *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                        ,matid);
  if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
  }
  this_00 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10);
  uVar3 = (**(code **)(*(long *)this_00 + 0x80))(this_00,local_60);
  *(undefined4 *)&in_RDI[10].field_0x4 = uVar3;
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  pbVar1 = local_40;
  __a = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT44(uVar3,in_stack_ffffffffffffff18),__a);
  uVar3 = (**(code **)(*(long *)pbVar1 + 0x80))(pbVar1,local_88);
  *(undefined4 *)(in_RDI + 0xb) = uVar3;
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  uVar3 = (**(code **)(*(long *)local_40 + 0x88))(local_40,*(undefined4 *)&in_RDI[10].field_0x4);
  *(undefined4 *)&in_RDI[0xb].field_0x4 = uVar3;
  TPZCompMesh::Reference((TPZCompMesh *)local_18);
  TVar4 = (TPZFunction<double>)TPZGeoMesh::NElements((TPZGeoMesh *)0x1c60b40);
  for (local_a0 = (TPZFunction<double>)0x0; (long)local_a0 < (long)TVar4;
      local_a0 = (TPZFunction<double>)((long)local_a0 + 1)) {
    TPZCompMesh::Reference((TPZCompMesh *)in_RDI[1]);
    in_stack_fffffffffffffee0 =
         (TPZGeoMesh *)
         TPZGeoMesh::Element(in_stack_fffffffffffffee0,
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if ((in_stack_fffffffffffffee0 != (TPZGeoMesh *)0x0) &&
       (in_stack_fffffffffffffedc =
             (*(in_stack_fffffffffffffee0->super_TPZSavable)._vptr_TPZSavable[0x42])(),
       in_stack_fffffffffffffedc == *(int *)(in_RDI + 10))) break;
  }
  if (local_a0 == TVar4) {
    pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
  }
  in_RDI[2] = local_a0;
  return;
}

Assistant:

TPZMeshSolution::TPZMeshSolution(TPZCompMesh *cmesh, int materialid) : 
TPZRegisterClassId(&TPZMeshSolution::ClassId),
fMesh(cmesh), fMaterialIndex(materialid)
{
    fDimension = cmesh->Dimension();
    fLastLoc.Resize(fDimension,0.);
    TPZMaterial *material = cmesh->FindMaterial(materialid);
    if (!material) {
        DebugStop();
    }
    fSolutionVarindex = material->VariableIndex("Pressure");
    fGradVarindex = material->VariableIndex("Derivative");
    fNumSolutions = material->NSolutionVariables(fSolutionVarindex);
    int64_t nel = cmesh->Reference()->NElements();
    int64_t el;
    for (el=0; el<nel; el++) {
        TPZGeoEl *gel = fMesh->Reference()->Element(el);
        if (gel && gel->Dimension() == fDimension) {
            break;
        }
    }
    if (el==nel) {
        DebugStop();
    }
    fGeoElIndex = el;
}